

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O1

void __thiscall
acto::actor::set_handler
          (actor *this,type_index *type,
          unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_> *h)

{
  handler_t *phVar1;
  handler_t *phVar2;
  mapped_type *pmVar3;
  
  if ((h->_M_t).
      super___uniq_ptr_impl<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>.
      _M_t.
      super__Tuple_impl<0UL,_acto::actor::handler_t_*,_std::default_delete<acto::actor::handler_t>_>
      .super__Head_base<0UL,_acto::actor::handler_t_*,_false>._M_head_impl == (handler_t *)0x0) {
    std::
    _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_std::allocator<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase();
    return;
  }
  pmVar3 = std::__detail::
           _Map_base<std::type_index,_std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_std::allocator<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_std::allocator<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->handlers_,type);
  phVar1 = (h->_M_t).
           super___uniq_ptr_impl<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_acto::actor::handler_t_*,_std::default_delete<acto::actor::handler_t>_>
           .super__Head_base<0UL,_acto::actor::handler_t_*,_false>._M_head_impl;
  (h->_M_t).
  super___uniq_ptr_impl<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>._M_t.
  super__Tuple_impl<0UL,_acto::actor::handler_t_*,_std::default_delete<acto::actor::handler_t>_>.
  super__Head_base<0UL,_acto::actor::handler_t_*,_false>._M_head_impl = (handler_t *)0x0;
  phVar2 = (pmVar3->_M_t).
           super___uniq_ptr_impl<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_acto::actor::handler_t_*,_std::default_delete<acto::actor::handler_t>_>
           .super__Head_base<0UL,_acto::actor::handler_t_*,_false>._M_head_impl;
  (pmVar3->_M_t).
  super___uniq_ptr_impl<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>._M_t.
  super__Tuple_impl<0UL,_acto::actor::handler_t_*,_std::default_delete<acto::actor::handler_t>_>.
  super__Head_base<0UL,_acto::actor::handler_t_*,_false>._M_head_impl = phVar1;
  if (phVar2 != (handler_t *)0x0) {
    (*phVar2->_vptr_handler_t[1])();
    return;
  }
  return;
}

Assistant:

void actor::set_handler(const std::type_index& type,
                        std::unique_ptr<handler_t> h) {
  if (h) {
    handlers_[type] = std::move(h);
  } else {
    handlers_.erase(type);
  }
}